

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O0

FloatBilerpTexture *
pbrt::FloatBilerpTexture::Create
          (Transform *renderFromTexture,TextureParameterDictionary *parameters,FileLoc *loc,
          Allocator alloc)

{
  FloatBilerpTexture *pFVar1;
  undefined8 in_RCX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  Float FVar2;
  Float FVar3;
  TextureMapping2DHandle map;
  FileLoc *in_stack_00000320;
  Transform *in_stack_00000328;
  ParameterDictionary *in_stack_00000330;
  Allocator in_stack_00000338;
  string *in_stack_fffffffffffffea8;
  TextureParameterDictionary *in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb8;
  allocator<char> *args_2;
  undefined4 in_stack_fffffffffffffed0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  allocator<char> *in_stack_fffffffffffffee0;
  allocator<char> *__a;
  undefined4 in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffeec;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffef0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  allocator<char> local_e1;
  string local_e0 [32];
  Float local_c0;
  allocator<char> local_b9;
  string local_b8 [32];
  Float local_98;
  allocator<char> local_91;
  string local_90 [32];
  Float local_70;
  allocator<char> local_59;
  string local_58 [36];
  Float local_34;
  undefined8 local_30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  undefined8 local_8;
  
  local_18 = in_RSI;
  local_8 = in_RCX;
  TextureParameterDictionary::operator_cast_to_ParameterDictionary_
            ((TextureParameterDictionary *)in_RSI);
  local_30 = local_8;
  TextureMapping2DHandle::Create
            (in_stack_00000330,in_stack_00000328,in_stack_00000320,in_stack_00000338);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffef0,
             (char *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
             in_stack_fffffffffffffee0);
  local_34 = TextureParameterDictionary::GetOneFloat
                       (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,0.0);
  this = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this,(char *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
             in_stack_fffffffffffffee0);
  FVar2 = TextureParameterDictionary::GetOneFloat
                    (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,0.0);
  __a = &local_b9;
  args = local_18;
  local_70 = FVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this,(char *)CONCAT44(FVar2,in_stack_fffffffffffffee8),__a);
  FVar3 = TextureParameterDictionary::GetOneFloat
                    (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,0.0);
  args_2 = &local_e1;
  local_98 = FVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this,(char *)CONCAT44(FVar2,in_stack_fffffffffffffee8),__a);
  local_c0 = TextureParameterDictionary::GetOneFloat
                       (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,0.0);
  pFVar1 = pstd::pmr::polymorphic_allocator<std::byte>::
           new_object<pbrt::FloatBilerpTexture,pbrt::TextureMapping2DHandle&,float,float,float,float>
                     ((polymorphic_allocator<std::byte> *)__a,(TextureMapping2DHandle *)args,
                      (float *)CONCAT44(FVar3,in_stack_fffffffffffffed0),(float *)args_2,
                      (float *)local_18,(float *)CONCAT44(local_c0,in_stack_fffffffffffffeb8));
  std::__cxx11::string::~string(local_e0);
  std::allocator<char>::~allocator(&local_e1);
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator(&local_b9);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator(&local_91);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator(&local_59);
  return pFVar1;
}

Assistant:

FloatBilerpTexture *FloatBilerpTexture::Create(
    const Transform &renderFromTexture, const TextureParameterDictionary &parameters,
    const FileLoc *loc, Allocator alloc) {
    // Initialize 2D texture mapping _map_ from _tp_
    TextureMapping2DHandle map =
        TextureMapping2DHandle::Create(parameters, renderFromTexture, loc, alloc);

    return alloc.new_object<FloatBilerpTexture>(
        map, parameters.GetOneFloat("v00", 0.f), parameters.GetOneFloat("v01", 1.f),
        parameters.GetOneFloat("v10", 0.f), parameters.GetOneFloat("v11", 1.f));
}